

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

void assign_rnd_level(d_level *dest,d_level *src,int range)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  
  dest->dnum = src->dnum;
  cVar4 = src->dlevel;
  if (range < 1) {
    uVar2 = mt_random();
    bVar3 = ~(byte)(uVar2 % (uint)-range);
  }
  else {
    uVar2 = mt_random();
    bVar3 = (char)(uVar2 % (uint)range) + 1;
  }
  cVar4 = cVar4 + bVar3;
  dest->dlevel = cVar4;
  cVar1 = dungeons[dest->dnum].num_dunlevs;
  if (cVar4 <= cVar1) {
    if ('\0' < cVar4) {
      return;
    }
    cVar1 = '\x01';
  }
  dest->dlevel = cVar1;
  return;
}

Assistant:

void assign_rnd_level(d_level *dest, const d_level *src, int range)
{
	dest->dnum = src->dnum;
	dest->dlevel = src->dlevel + ((range > 0) ? rnd(range) : -rnd(-range)) ;

	if (dest->dlevel > dunlevs_in_dungeon(dest))
		dest->dlevel = dunlevs_in_dungeon(dest);
	else if (dest->dlevel < 1)
		dest->dlevel = 1;
}